

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

D_ParseNode * dparse(D_Parser *ap,char *buf,int buf_len)

{
  uint32 *puVar1;
  ZNode **ppZVar2;
  ZNode *pZVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  int iVar6;
  uint uVar7;
  Parser *pPVar8;
  D_Scope *pDVar9;
  PNode *pPVar10;
  PNode *_t;
  PNode *pn;
  ulong uVar11;
  PNode *pPVar12;
  SNode *s;
  D_ParseNode *pDVar13;
  ZNode *local_40;
  
  *(undefined4 *)&ap[1].syntax_error_fn = 0;
  ap[1].ambiguity_fn = (D_AmbiguityFn)0x0;
  ap[1].free_node_fn = (D_FreeNodeFn)0x0;
  ap[1].initial_globals = buf;
  ap[1].initial_white_space_fn = (D_WhiteSpaceFn)(buf + buf_len);
  if (*(int *)&(ap[1].initial_scope)->updates != 0) {
    pPVar8 = new_subparser((Parser *)ap);
    ap[3].initial_scope = (D_Scope *)pPVar8;
    (pPVar8->user).initial_white_space_fn = null_white_space;
    (pPVar8->user).error_recovery = 0;
    (pPVar8->user).partial_parses = 1;
    (pPVar8->user).free_node_fn = ap->free_node_fn;
  }
  alloc_parser_working_data((Parser *)ap);
  if (ap->initial_scope == (D_Scope *)0x0) {
    if ((D_Scope *)ap[2].initial_white_space_fn != (D_Scope *)0x0) {
      free_D_Scope((D_Scope *)ap[2].initial_white_space_fn,0);
    }
    pDVar9 = new_D_Scope((D_Scope *)0x0);
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)pDVar9;
    *(byte *)pDVar9 = *(byte *)pDVar9 | 3;
  }
  else {
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)ap->initial_scope;
  }
  iVar6 = exhaustive_parse((Parser *)ap,ap->start_state);
  s = (SNode *)ap[2].initial_scope;
  if (iVar6 == 0) {
    uVar7 = (s->zns).n;
    if (uVar7 == 1) {
      pPVar10 = (*(s->zns).v)->pn;
    }
    else {
      local_40 = (ZNode *)0x0;
      pPVar12 = (PNode *)0x0;
      pPVar10 = (PNode *)0x0;
      for (uVar11 = 0; ppZVar2 = (s->zns).v, uVar11 < uVar7; uVar11 = uVar11 + 1) {
        pZVar3 = ppZVar2[uVar11];
        pn = pPVar10;
        if (pZVar3 != (ZNode *)0x0) {
          pPVar4 = pZVar3->pn;
          pn = pPVar4->latest;
          while (pPVar5 = pn->latest, pn != pPVar5) {
            pPVar5->refcount = pPVar5->refcount + 1;
            puVar1 = &pn->refcount;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              free_PNode((Parser *)ap,pn);
            }
            pPVar4->latest = pPVar5;
            pn = pPVar5;
          }
          if (pPVar10 == (PNode *)0x0) {
            local_40 = (s->zns).v[uVar11];
          }
          else {
            if (((pn != pPVar10) && (pn->ambiguities == (PNode *)0x0)) && (pn != pPVar12)) {
              pn->ambiguities = pPVar10->ambiguities;
              pn->refcount = pn->refcount + 1;
              pPVar10->ambiguities = pn;
              if (pPVar12 == (PNode *)0x0) {
                pPVar12 = pn;
              }
            }
            free_ZNode((Parser *)ap,(s->zns).v[uVar11],s);
            pn = pPVar10;
          }
        }
        uVar7 = (s->zns).n;
        pPVar10 = pn;
      }
      *ppZVar2 = local_40;
      (s->zns).n = 1;
      (s->zns).i = 0;
    }
    pPVar10 = commit_tree((Parser *)ap,pPVar10);
    if (pPVar10 == (PNode *)0x0) {
      free_parser_working_data((Parser *)ap);
      free_whitespace_parser((Parser *)ap);
      return (D_ParseNode *)0x0;
    }
    if ((d_verbose_level != 0) &&
       (printf("%d states %d scans %d shifts %d reductions %d compares %d ambiguities\n",
               (ulong)*(uint *)&ap[1].syntax_error_fn,(ulong)*(uint *)&ap[1].ambiguity_fn,
               (ulong)*(uint *)((long)&ap[1].ambiguity_fn + 4),(ulong)*(uint *)&ap[1].free_node_fn,
               (ulong)*(uint *)((long)&ap[1].free_node_fn + 4),*(undefined4 *)&ap[1].loc.s),
       ap->save_parse_tree != 0)) {
      if (d_verbose_level < 2) {
        print_paren((Parser *)ap,pPVar10);
      }
      else {
        xprint_paren((Parser *)ap,pPVar10);
      }
      putchar(10);
    }
    if (ap->save_parse_tree == 0) {
      pDVar13 = (D_ParseNode *)0x1;
    }
    else {
      pPVar10->refcount = pPVar10->refcount + 1;
      pDVar13 = &pPVar10->parse_node;
    }
    s = (SNode *)ap[2].initial_scope;
  }
  else {
    pDVar13 = (D_ParseNode *)0x0;
    if (s == (SNode *)0x0) goto LAB_00142188;
  }
  puVar1 = &s->refcount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    free_SNode((Parser *)ap,s);
  }
  ap[2].initial_scope = (D_Scope *)0x0;
LAB_00142188:
  free_parser_working_data((Parser *)ap);
  free_whitespace_parser((Parser *)ap);
  return pDVar13;
}

Assistant:

D_ParseNode *dparse(D_Parser *ap, char *buf, int buf_len) {
  uint r;
  Parser *p = (Parser *)ap;
  SNode *sn;
  PNode *pn;
  D_ParseNode *res = NULL;

  p->states = p->scans = p->shifts = p->reductions = p->compares = 0;
  p->start = buf;
  p->end = buf + buf_len;

  initialize_whitespace_parser(p);
  alloc_parser_working_data(p);
  if (p->user.initial_scope)
    p->top_scope = p->user.initial_scope;
  else {
    if (p->top_scope) free_D_Scope(p->top_scope, 0);
    p->top_scope = new_D_Scope(NULL);
    p->top_scope->kind = D_SCOPE_SEQUENTIAL;
  }
  r = exhaustive_parse(p, p->user.start_state);
  if (!r) {
    sn = p->accept;
    if (sn->zns.n != 1)
      pn = handle_top_level_ambiguities(p, sn);
    else
      pn = sn->zns.v[0]->pn;
    pn = commit_tree(p, pn);
    if (!pn) {
      free_parser_working_data(p);
      free_whitespace_parser(p);
      return NULL;
    }
    if (d_verbose_level) {
      printf(
          "%d states %d scans %d shifts %d reductions "
          "%d compares %d ambiguities\n",
          p->states, p->scans, p->shifts, p->reductions, p->compares, p->ambiguities);
      if (p->user.save_parse_tree) {
        if (d_verbose_level > 1)
          xprint_paren(p, pn);
        else
          print_paren(p, pn);
        printf("\n");
      }
    }
    if (p->user.save_parse_tree) {
      ref_pn(pn);
      res = &pn->parse_node;
    } else
      res = NO_DPN;
    unref_sn(p, p->accept);
    p->accept = NULL;
  } else {
    if (p->accept) {
      unref_sn(p, p->accept);
      p->accept = NULL;
    }
  }
  free_parser_working_data(p);
  free_whitespace_parser(p);
  return res;
}